

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvParticle_dns.c
# Opt level: O3

int PrintUserData(UserData udata)

{
  int iVar1;
  
  if (udata == (UserData)0x0) {
    iVar1 = -1;
  }
  else {
    puts("\nParticle traveling on the unit circle example");
    puts("---------------------------------------------");
    printf("alpha      = %0.4e\n",udata->alpha);
    iVar1 = 0;
    printf("num orbits = %d\n",(ulong)(uint)udata->orbits);
    puts("---------------------------------------------");
    printf("rtol       = %g\n",udata->rtol);
    printf("atol       = %g\n",udata->atol);
    printf("proj sol   = %d\n",(ulong)(uint)udata->proj);
    printf("proj err   = %d\n",(ulong)(uint)udata->projerr);
    printf("nout       = %d\n",(ulong)(uint)udata->nout);
    printf("tstop      = %d\n",(ulong)(uint)udata->tstop);
    puts("---------------------------------------------");
  }
  return iVar1;
}

Assistant:

static int PrintUserData(UserData udata)
{
  if (udata == NULL) { return (-1); }

  printf("\nParticle traveling on the unit circle example\n");
  printf("---------------------------------------------\n");
  printf("alpha      = %0.4" ESYM "\n", udata->alpha);
  printf("num orbits = %d\n", udata->orbits);
  printf("---------------------------------------------\n");
  printf("rtol       = %" GSYM "\n", udata->rtol);
  printf("atol       = %" GSYM "\n", udata->atol);
  printf("proj sol   = %d\n", udata->proj);
  printf("proj err   = %d\n", udata->projerr);
  printf("nout       = %d\n", udata->nout);
  printf("tstop      = %d\n", udata->tstop);
  printf("---------------------------------------------\n");

  return (0);
}